

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Environmental_Process_PDU::~Environmental_Process_PDU(Environmental_Process_PDU *this)

{
  Environmental_Process_PDU *this_local;
  
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Environmental_Process_PDU_0032f228;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ::clear(&this->m_vEnvRecords);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ::~vector(&this->m_vEnvRecords);
  DATA_TYPE::EnvironmentType::~EnvironmentType(&this->m_EnvType);
  DATA_TYPE::EntityIdentifier::~EntityIdentifier(&this->m_EnvProcID);
  Header7::~Header7(&this->super_Header);
  return;
}

Assistant:

Environmental_Process_PDU::~Environmental_Process_PDU()
{
    m_vEnvRecords.clear();
}